

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O0

void Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
               (ParseNodePtr patternNode,anon_class_24_3_c793ac44 handler)

{
  code *pcVar1;
  bool bVar2;
  ParseNodeBin *pPVar3;
  undefined4 *puVar4;
  ParseNodeArrLit *pPVar5;
  ParseNodeUni *pPVar6;
  ParseNode *local_10;
  ParseNodePtr patternNode_local;
  
  local_10 = patternNode;
  if (patternNode->nop == knopAsg) {
    pPVar3 = ParseNode::AsParseNodeBin(patternNode);
    local_10 = pPVar3->pnode1;
  }
  bVar2 = ParseNode::IsPattern(local_10);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (local_10->nop == knopArrayPattern) {
    pPVar5 = ParseNode::AsParseNodeArrLit(local_10);
    ForEachItemInList<Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>(ParseNode*,ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6)::_lambda(ParseNode*)_1_>
              ((pPVar5->super_ParseNodeUni).pnode1,&handler);
  }
  else {
    pPVar6 = ParseNode::AsParseNodeUni(local_10);
    ForEachItemInList<Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>(ParseNode*,ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6)::_lambda(ParseNode*)_2_>
              (pPVar6->pnode1,&handler);
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }